

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseTriangleCase::iterate(BaseTriangleCase *this)

{
  size_type *psVar1;
  pointer pVVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  pointer pSVar7;
  pointer pVVar8;
  char *description;
  IterateResult IVar9;
  pointer pVVar10;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  string iterationDescription;
  ScopedLogSection section;
  Surface resultImage;
  undefined1 local_248 [24];
  long lStack_230;
  pointer local_228;
  pointer pSStack_220;
  pointer local_218;
  long lStack_210;
  string local_200;
  ScopedLogSection local_1e0;
  RasterizationArguments local_1d8;
  undefined4 uStack_1c4;
  undefined1 local_1b8 [32];
  Surface local_198 [4];
  ios_base local_128 [264];
  
  iVar4 = *(int *)&(this->super_BaseRenderingCase).field_0xc4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::operator<<(local_198,iVar4 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_1b8,0,(char *)0x0,0x1bccacd);
  pSVar7 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pSVar7) {
    local_218 = *(pointer *)pSVar7->positions[0].m_data;
    lStack_210 = plVar5[3];
    local_228 = (pointer)&local_218;
  }
  else {
    local_218 = *(pointer *)pSVar7->positions[0].m_data;
    local_228 = (pointer)*plVar5;
  }
  pSStack_220 = (pointer)plVar5[1];
  *plVar5 = (long)pSVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
  pVVar2 = (pointer)(local_248 + 0x10);
  pVVar8 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pVVar8) {
    local_248._16_8_ = *(undefined8 *)pVVar8->m_data;
    lStack_230 = plVar5[3];
    local_248._0_8_ = pVVar2;
  }
  else {
    local_248._16_8_ = *(undefined8 *)pVVar8->m_data;
    local_248._0_8_ = (pointer)*plVar5;
  }
  local_248._8_8_ = plVar5[1];
  *plVar5 = (long)pVVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::operator<<(local_198,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  pVVar8 = (pointer)((long)(float *)local_248._8_8_ +
                    CONCAT44(local_1d8.greenBits,local_1d8.redBits));
  pVVar10 = (pointer)0xf;
  if ((pointer)local_248._0_8_ != pVVar2) {
    pVVar10 = (pointer)local_248._16_8_;
  }
  if (pVVar10 < pVVar8) {
    pVVar10 = (pointer)0xf;
    if ((int *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples) != &local_1d8.blueBits) {
      pVVar10 = (pointer)CONCAT44(uStack_1c4,local_1d8.blueBits);
    }
    if (pVVar8 <= pVVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,local_248._0_8_);
      goto LAB_0106bc14;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append
                     (local_248,(ulong)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples));
LAB_0106bc14:
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200.field_2._8_8_ = puVar6[3];
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_200._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((int *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples) != &local_1d8.blueBits) {
    operator_delete((undefined1 *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples),
                    CONCAT44(uStack_1c4,local_1d8.blueBits) + 1);
  }
  if ((pointer)local_248._0_8_ != pVVar2) {
    operator_delete((void *)local_248._0_8_,(ulong)((long)(float *)local_248._16_8_ + 1));
  }
  if (local_228 != (pointer)&local_218) {
    operator_delete(local_228,(ulong)((long)local_218->positions[0].m_data + 1));
  }
  if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,(ulong)((long)((Vec4 *)local_1b8._16_8_)->m_data + 1));
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1e0,
             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log,&local_200,&local_200);
  iVar4 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(local_198,iVar4,iVar4);
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = (pointer)0x0;
  local_218 = (pointer)0x0;
  local_228 = (pointer)0x0;
  pSStack_220 = (pointer)0x0;
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7])
            (this,(ulong)*(uint *)&(this->super_BaseRenderingCase).field_0xc4);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,local_198,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_248,
             this->m_primitiveDrawType);
  local_1d8.numSamples = (this->super_BaseRenderingCase).m_numSamples;
  local_1d8.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
  local_1d8.redBits = (this->super_BaseRenderingCase).m_pixelFormat.redBits;
  local_1d8.greenBits = (this->super_BaseRenderingCase).m_pixelFormat.greenBits;
  local_1d8.blueBits = (this->super_BaseRenderingCase).m_pixelFormat.blueBits;
  local_1b8._0_8_ = local_228;
  local_1b8._8_8_ = pSStack_220;
  local_1b8._16_8_ = local_218;
  local_228 = (pointer)0x0;
  pSStack_220 = (pointer)0x0;
  local_218 = (pointer)0x0;
  bVar3 = tcu::verifyTriangleGroupRasterization
                    (local_198,(TriangleSceneSpec *)local_1b8,&local_1d8,
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log,VERIFICATIONMODE_STRICT);
  if (!bVar3) {
    this->m_allIterationsPassed = false;
  }
  if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ - local_1b8._0_8_);
  }
  iVar4 = *(int *)&(this->super_BaseRenderingCase).field_0xc4 + 1;
  *(int *)&(this->super_BaseRenderingCase).field_0xc4 = iVar4;
  IVar9 = CONTINUE;
  if (iVar4 == this->m_iterationCount) {
    description = "Incorrect rasterization";
    if (this->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar9 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,this->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  if (local_228 != (pointer)0x0) {
    operator_delete(local_228,(long)local_218 - (long)local_228);
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  tcu::Surface::~Surface(local_198);
  tcu::TestLog::endSection(local_1e0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  return IVar9;
}

Assistant:

BaseTriangleCase::IterateResult BaseTriangleCase::iterate (void)
{
	const std::string								iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection						section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	tcu::Surface									resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	generateTriangles(m_iteration, drawBuffer, triangles);

	// draw image
	drawPrimitives(resultImage, drawBuffer, m_primitiveDrawType);

	// compare
	{
		bool					compareOk;
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= getPixelFormat().redBits;
		args.greenBits		= getPixelFormat().greenBits;
		args.blueBits		= getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		compareOk = verifyTriangleGroupRasterization(resultImage, scene, args, m_testCtx.getLog());

		if (!compareOk)
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rasterization");

		return STOP;
	}
	else
		return CONTINUE;
}